

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_script.cpp
# Opt level: O1

Script * cfd::core::ContractHashUtil::GetContractScript
                   (Script *__return_storage_ptr__,Script *claim_script,Script *fedpeg_script)

{
  pointer puVar1;
  Script *pSVar2;
  bool bVar3;
  bool bVar4;
  ScriptOperator *this;
  size_t sVar5;
  pointer this_00;
  bool bVar6;
  bool bVar7;
  ScriptBuilder builder;
  ByteData256 tweak;
  ByteData pubkey_data;
  ByteData claim_script_data;
  ByteData data;
  ByteData256 local_108;
  ScriptBuilder local_e8;
  ByteData256 local_c8;
  ByteData local_b0;
  Script *local_98;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_90;
  ByteData local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  
  bVar3 = CheckLiquidV1Watchman(fedpeg_script);
  local_e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00694218;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::GetData(&local_78,claim_script);
  ByteData::ByteData(&local_b0);
  local_98 = __return_storage_ptr__;
  ByteData256::ByteData256(&local_c8);
  Script::GetElementList(&local_90,fedpeg_script);
  if (local_90.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = false;
    bVar7 = false;
    this_00 = local_90.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (bVar3) {
        this = ScriptElement::GetOpCode(this_00);
        bVar4 = ScriptOperator::operator==(this,(ScriptOperator *)ScriptOperator::OP_ELSE);
        bVar7 = bVar6;
        if (bVar4) {
          bVar6 = true;
          bVar7 = true;
        }
      }
      ScriptElement::GetBinaryData(&local_48,this_00);
      if ((bVar7) || (this_00->type_ != kElementBinary)) {
LAB_004738e7:
        ScriptBuilder::AppendElement(&local_e8,this_00);
      }
      else {
        sVar5 = ByteData::GetDataSize(&local_48);
        if (sVar5 != 0x21) goto LAB_004738e7;
        ByteData::GetBytes(&local_60,&local_48);
        CryptoUtil::HmacSha256(&local_108,&local_60,&local_78);
        puVar1 = local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1);
        }
        if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        WallyUtil::AddTweakPubkey((ByteData *)&local_108,&local_48,&local_c8,true);
        puVar1 = local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1);
        }
        if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ScriptBuilder::AppendData(&local_e8,&local_b0);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_90.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_90);
  pSVar2 = local_98;
  ScriptBuilder::Build(local_98,&local_e8);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00694218;
  if (local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pSVar2;
}

Assistant:

Script ContractHashUtil::GetContractScript(
    const Script& claim_script, const Script& fedpeg_script) {
  bool is_liquidv1_watchman = CheckLiquidV1Watchman(fedpeg_script);

  ScriptBuilder builder;
  ByteData claim_script_data = claim_script.GetData();
  bool liquidv1_op_else = false;
  ByteData pubkey_data;
  ByteData256 tweak;
  for (const ScriptElement& element : fedpeg_script.GetElementList()) {
    if (is_liquidv1_watchman &&
        (element.GetOpCode() == ScriptOperator::OP_ELSE)) {
      liquidv1_op_else = true;
    }
    ByteData data = element.GetBinaryData();
    if ((!liquidv1_op_else) && element.IsBinary() &&
        (data.GetDataSize() == Pubkey::kCompressedPubkeySize)) {
      tweak = CryptoUtil::HmacSha256(data.GetBytes(), claim_script_data);
      pubkey_data = WallyUtil::AddTweakPubkey(data, tweak, true);
      builder.AppendData(pubkey_data);
    } else {
      builder.AppendElement(element);
    }
  }

  return builder.Build();
}